

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall Parse::Object::setAttach(Object *this,string *anchor,string *coordN)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  Attach *pAVar4;
  
  if (this->attach == (Attach *)0x0) {
    pAVar4 = (Attach *)operator_new(0x80);
    (pAVar4->top)._M_dataplus._M_p = (pointer)0x0;
    (pAVar4->top)._M_string_length = 0;
    (pAVar4->top).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pAVar4->top).field_2 + 8) = 0;
    (pAVar4->bottom)._M_dataplus._M_p = (pointer)0x0;
    (pAVar4->bottom)._M_string_length = 0;
    (pAVar4->bottom).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pAVar4->bottom).field_2 + 8) = 0;
    (pAVar4->left)._M_dataplus._M_p = (pointer)0x0;
    (pAVar4->left)._M_string_length = 0;
    (pAVar4->left).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pAVar4->left).field_2 + 8) = 0;
    (pAVar4->right)._M_dataplus._M_p = (pointer)0x0;
    (pAVar4->right)._M_string_length = 0;
    (pAVar4->right).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pAVar4->right).field_2 + 8) = 0;
    (pAVar4->top)._M_dataplus._M_p = (pointer)&(pAVar4->top).field_2;
    (pAVar4->top)._M_string_length = 0;
    (pAVar4->top).field_2._M_local_buf[0] = '\0';
    (pAVar4->bottom)._M_dataplus._M_p = (pointer)&(pAVar4->bottom).field_2;
    (pAVar4->bottom)._M_string_length = 0;
    (pAVar4->bottom).field_2._M_local_buf[0] = '\0';
    (pAVar4->left)._M_dataplus._M_p = (pointer)&(pAVar4->left).field_2;
    (pAVar4->left)._M_string_length = 0;
    (pAVar4->left).field_2._M_local_buf[0] = '\0';
    (pAVar4->right)._M_dataplus._M_p = (pointer)&(pAVar4->right).field_2;
    (pAVar4->right)._M_string_length = 0;
    (pAVar4->right).field_2._M_local_buf[0] = '\0';
    this->attach = pAVar4;
  }
  iVar3 = std::__cxx11::string::compare((char *)anchor);
  if (iVar3 == 0) {
    pcVar1 = (coordN->_M_dataplus)._M_p;
    pAVar4 = this->attach;
    pcVar2 = (char *)(pAVar4->left)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&pAVar4->left,0,pcVar2,(ulong)pcVar1);
  }
  iVar3 = std::__cxx11::string::compare((char *)anchor);
  if (iVar3 == 0) {
    pcVar1 = (coordN->_M_dataplus)._M_p;
    pAVar4 = this->attach;
    pcVar2 = (char *)(pAVar4->right)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&pAVar4->right,0,pcVar2,(ulong)pcVar1);
  }
  iVar3 = std::__cxx11::string::compare((char *)anchor);
  if (iVar3 == 0) {
    pcVar1 = (coordN->_M_dataplus)._M_p;
    pAVar4 = this->attach;
    pcVar2 = (char *)(pAVar4->top)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)pAVar4,0,pcVar2,(ulong)pcVar1);
  }
  iVar3 = std::__cxx11::string::compare((char *)anchor);
  if (iVar3 != 0) {
    return;
  }
  pcVar1 = (coordN->_M_dataplus)._M_p;
  pAVar4 = this->attach;
  pcVar2 = (char *)(pAVar4->bottom)._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)&pAVar4->bottom,0,pcVar2,(ulong)pcVar1);
  return;
}

Assistant:

void setAttach(std::string anchor, std::string coordN) {
                if (attach == NULL) {
                    attach = new Attach();
                }
                if (anchor == "left_attach") {
                    attach->left = (coordN.c_str());
                }
                if (anchor == "right_attach") {
                    attach->right = (coordN.c_str());
                }
                if (anchor == "top_attach") {
                    attach->top = (coordN.c_str());
                }
                if (anchor == "bottom_attach") {
                    attach->bottom = (coordN.c_str());
                }
            }